

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::ContentEncoding::ParseEncryptionEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentEncryption *encryption)

{
  long lVar1;
  int iVar2;
  long lVar3;
  longlong lVar4;
  uchar *puVar5;
  long status_1;
  int read_status_2;
  uchar *buf_2;
  size_t buflen_2;
  int read_status_1;
  uchar *buf_1;
  size_t buflen_1;
  int read_status;
  uchar *buf;
  size_t buflen;
  long status;
  longlong size_1;
  longlong id;
  longlong stop;
  longlong pos;
  ContentEncryption *encryption_local;
  IMkvReader *pReader_local;
  longlong size_local;
  longlong start_local;
  ContentEncoding *this_local;
  
  pos = (longlong)encryption;
  encryption_local = (ContentEncryption *)pReader;
  pReader_local = (IMkvReader *)size;
  size_local = start;
  start_local = (longlong)this;
  if (pReader == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1110,
                  "long mkvparser::ContentEncoding::ParseEncryptionEntry(long long, long long, IMkvReader *, ContentEncryption *)"
                 );
  }
  if (encryption == (ContentEncryption *)0x0) {
    __assert_fail("encryption",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1111,
                  "long mkvparser::ContentEncoding::ParseEncryptionEntry(long long, long long, IMkvReader *, ContentEncryption *)"
                 );
  }
  id = start + size;
  stop = start;
  do {
    if (id <= stop) {
      return 0;
    }
    lVar3 = ParseElementHeader((IMkvReader *)encryption_local,&stop,id,&size_1,&status);
    if (lVar3 < 0) {
      return lVar3;
    }
    if (size_1 == 0x47e1) {
      lVar4 = UnserializeUInt((IMkvReader *)encryption_local,stop,status);
      *(longlong *)pos = lVar4;
      if (*(long *)pos != 5) {
        return -2;
      }
    }
    else if (size_1 == 0x47e2) {
      if (*(void **)(pos + 8) != (void *)0x0) {
        operator_delete__(*(void **)(pos + 8));
      }
      lVar1 = status;
      *(undefined8 *)(pos + 8) = 0;
      *(undefined8 *)(pos + 0x10) = 0;
      if (status < 1) {
        return -2;
      }
      puVar5 = SafeArrayAlloc<unsigned_char>(1,status);
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      iVar2 = (**(code **)encryption_local->algo)(encryption_local,stop,lVar1,puVar5);
      if (iVar2 != 0) {
        if (puVar5 == (uchar *)0x0) {
          return lVar3;
        }
        operator_delete__(puVar5);
        return lVar3;
      }
      *(uchar **)(pos + 8) = puVar5;
      *(long *)(pos + 0x10) = lVar1;
    }
    else if (size_1 == 0x47e3) {
      if (*(void **)(pos + 0x18) != (void *)0x0) {
        operator_delete__(*(void **)(pos + 0x18));
      }
      lVar1 = status;
      *(undefined8 *)(pos + 0x18) = 0;
      *(undefined8 *)(pos + 0x20) = 0;
      if (status < 1) {
        return -2;
      }
      puVar5 = SafeArrayAlloc<unsigned_char>(1,status);
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      iVar2 = (**(code **)encryption_local->algo)(encryption_local,stop,lVar1,puVar5);
      if (iVar2 != 0) {
        if (puVar5 == (uchar *)0x0) {
          return lVar3;
        }
        operator_delete__(puVar5);
        return lVar3;
      }
      *(uchar **)(pos + 0x18) = puVar5;
      *(long *)(pos + 0x20) = lVar1;
    }
    else if (size_1 == 0x47e4) {
      if (*(void **)(pos + 0x28) != (void *)0x0) {
        operator_delete__(*(void **)(pos + 0x28));
      }
      lVar1 = status;
      *(undefined8 *)(pos + 0x28) = 0;
      *(undefined8 *)(pos + 0x30) = 0;
      if (status < 1) {
        return -2;
      }
      puVar5 = SafeArrayAlloc<unsigned_char>(1,status);
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      iVar2 = (**(code **)encryption_local->algo)(encryption_local,stop,lVar1,puVar5);
      if (iVar2 != 0) {
        if (puVar5 == (uchar *)0x0) {
          return lVar3;
        }
        operator_delete__(puVar5);
        return lVar3;
      }
      *(uchar **)(pos + 0x28) = puVar5;
      *(long *)(pos + 0x30) = lVar1;
    }
    else if (size_1 == 0x47e5) {
      lVar4 = UnserializeUInt((IMkvReader *)encryption_local,stop,status);
      *(longlong *)(pos + 0x38) = lVar4;
    }
    else if (size_1 == 0x47e6) {
      lVar4 = UnserializeUInt((IMkvReader *)encryption_local,stop,status);
      *(longlong *)(pos + 0x40) = lVar4;
    }
    else if ((size_1 == 0x47e7) &&
            (lVar3 = ParseContentEncAESSettingsEntry
                               (this,stop,status,(IMkvReader *)encryption_local,
                                (ContentEncAESSettings *)(pos + 0x48)), lVar3 != 0)) {
      return lVar3;
    }
    stop = status + stop;
    if (id < stop) {
      return -2;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseEncryptionEntry(long long start, long long size,
                                           IMkvReader* pReader,
                                           ContentEncryption* encryption) {
  assert(pReader);
  assert(encryption);

  long long pos = start;
  const long long stop = start + size;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentEncAlgo) {
      encryption->algo = UnserializeUInt(pReader, pos, size);
      if (encryption->algo != 5)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvContentEncKeyID) {
      delete[] encryption->key_id;
      encryption->key_id = NULL;
      encryption->key_id_len = 0;

      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      encryption->key_id = buf;
      encryption->key_id_len = buflen;
    } else if (id == libwebm::kMkvContentSignature) {
      delete[] encryption->signature;
      encryption->signature = NULL;
      encryption->signature_len = 0;

      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      encryption->signature = buf;
      encryption->signature_len = buflen;
    } else if (id == libwebm::kMkvContentSigKeyID) {
      delete[] encryption->sig_key_id;
      encryption->sig_key_id = NULL;
      encryption->sig_key_id_len = 0;

      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      encryption->sig_key_id = buf;
      encryption->sig_key_id_len = buflen;
    } else if (id == libwebm::kMkvContentSigAlgo) {
      encryption->sig_algo = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentSigHashAlgo) {
      encryption->sig_hash_algo = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentEncAESSettings) {
      const long status = ParseContentEncAESSettingsEntry(
          pos, size, pReader, &encryption->aes_settings);
      if (status)
        return status;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;
}